

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O0

void * Kf_WorkerThread(void *pArg)

{
  int fArea;
  int fCutMin_00;
  Kf_Man_t *p;
  Kf_Set_t *p_00;
  abctime aVar1;
  int *pCuts0;
  int *pCuts1;
  abctime aVar2;
  abctime clk;
  int *pPlace;
  int fCutMin;
  int fAreaOnly;
  Kf_Man_t *pMan;
  Kf_ThData_t *pThData;
  void *pArg_local;
  
  p = (Kf_Man_t *)**pArg;
  fArea = *(int *)(*(long *)(**pArg + 8) + 0x38);
  fCutMin_00 = *(int *)(*(long *)(**pArg + 8) + 0x58);
  while( true ) {
    do {
    } while (*(int *)((long)pArg + 0xc) == 0);
    if (*(int *)((long)pArg + 0xc) != 1) {
      __assert_fail("pThData->Status == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                    ,0x3cd,"void *Kf_WorkerThread(void *)");
    }
    if (*(int *)((long)pArg + 8) == -1) {
      pthread_exit((void *)0x0);
    }
    if (*(int *)((long)pArg + 8) < 0) break;
    aVar1 = Abc_Clock();
    p_00 = *pArg;
    pCuts0 = Kf_ObjCuts0(p,*(int *)((long)pArg + 8));
    pCuts1 = Kf_ObjCuts1(p,*(int *)((long)pArg + 8));
    Kf_SetMergeOrder(p_00,pCuts0,pCuts1,fArea,fCutMin_00);
    aVar2 = Abc_Clock();
    *(abctime *)((long)pArg + 0x10) = (aVar2 - aVar1) + *(long *)((long)pArg + 0x10);
    *(undefined4 *)((long)pArg + 0xc) = 0;
  }
  __assert_fail("pThData->Id >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                ,0x3d4,"void *Kf_WorkerThread(void *)");
}

Assistant:

void * Kf_WorkerThread( void * pArg )
{
    Kf_ThData_t * pThData = (Kf_ThData_t *)pArg;
    Kf_Man_t * pMan = pThData->pSett->pMan;
    int fAreaOnly = pThData->pSett->pMan->pPars->fAreaOnly;
    int fCutMin = pThData->pSett->pMan->pPars->fCutMin;
    volatile int * pPlace = &pThData->Status;
    abctime clk;
    while ( 1 )
    {
        while ( *pPlace == 0 );
        assert( pThData->Status == 1 );
        if ( pThData->Id == -1 )
        {
            pthread_exit( NULL );
            assert( 0 );
            return NULL;
        }
        assert( pThData->Id >= 0 );
        clk = Abc_Clock();
        Kf_SetMergeOrder( pThData->pSett, Kf_ObjCuts0(pMan, pThData->Id), Kf_ObjCuts1(pMan, pThData->Id), fAreaOnly, fCutMin );
        pThData->clkUsed += Abc_Clock() - clk;
        pThData->Status = 0;
//        printf( "Finished object %d\n", pThData->Id );
    }
    assert( 0 );
    return NULL;
}